

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.cpp
# Opt level: O2

string * __thiscall poly::pretty_abi_cxx11_(string *__return_storage_ptr__,poly *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  __string_type s;
  stringstream ss;
  ostream local_1a8 [376];
  
  iVar1 = degree(this);
  if (iVar1 == 0) {
    iVar1 = operator[](this,0);
    std::__cxx11::to_string(__return_storage_ptr__,iVar1);
  }
  else {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    iVar1 = degree(this);
    for (; 1 < iVar1; iVar1 = iVar1 + -1) {
      iVar2 = operator[](this,iVar1);
      if (iVar2 != 0) {
        poVar3 = std::operator<<(local_1a8,"x^");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
        std::operator<<(poVar3," + ");
      }
    }
    iVar1 = operator[](this,1);
    if (iVar1 != 0) {
      std::operator<<(local_1a8,"x + ");
    }
    iVar1 = operator[](this,0);
    if (iVar1 != 0) {
      std::operator<<(local_1a8,"1 + ");
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,&s,0,s._M_string_length - 3);
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string poly::pretty() const {
    const auto &rthis = *this;
    if (degree() == 0)
        return std::to_string(rthis[0]);

    std::stringstream ss;
    for (int i = degree(); i >= 2; i--)
        if (rthis[i])
            ss << "x^" << i << " + ";
    if (rthis[1])
        ss << "x + ";
    if (rthis[0])
        ss << "1 + ";

    auto s = ss.str();
    return s.substr(0, s.size() - 3);
}